

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O2

SoapySDRArgInfo * callocArrayType<SoapySDRArgInfo>(size_t length)

{
  SoapySDRArgInfo *pSVar1;
  undefined8 *puVar2;
  
  pSVar1 = (SoapySDRArgInfo *)calloc(length,0x60);
  if (pSVar1 != (SoapySDRArgInfo *)0x0) {
    return pSVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = __cxa_init_primary_exception;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

T *callocArrayType(const size_t length)
{
    auto out = (T *)std::calloc(length, sizeof(T));
    if (out == nullptr) throw std::bad_alloc();
    return out;
}